

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O0

void __thiscall
CaDiCaL::LratChecker::delete_clause
          (LratChecker *this,uint64_t id,bool param_3,vector<int,_std::allocator<int>_> *c)

{
  undefined8 uVar1;
  unsigned_long uVar2;
  long lVar3;
  bool bVar4;
  char *pcVar5;
  unsigned_long *puVar6;
  uint *puVar7;
  Profile *profile;
  byte in_DL;
  time_t *in_RSI;
  FILE *__b;
  long in_RDI;
  double s;
  double s_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int *lit_4;
  iterator __end2_2;
  iterator __begin2_2;
  vector<int,_std::allocator<int>_> *__range2_2;
  int *lit_3;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  int *lit_2;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  int lit_1;
  uint i;
  int *dp;
  int *lit;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  LratCheckerClause *d;
  LratCheckerClause **p;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffed8;
  Internal *pIVar10;
  LratChecker *in_stack_fffffffffffffee0;
  undefined4 uVar11;
  undefined4 uVar12;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef8;
  double dVar13;
  LratChecker *in_stack_ffffffffffffff00;
  double dVar14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_c0;
  long local_b8;
  undefined1 local_b0 [112];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  long local_38;
  LratCheckerClause *local_30;
  LratCheckerClause **local_28;
  byte local_11;
  time_t *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if (*(int *)(*(long *)(in_RDI + 8) + 0x1680) <= *(int *)(*(long *)(in_RDI + 8) + 0xe18)) {
    pIVar10 = *(Internal **)(in_RDI + 8);
    lVar3 = *(long *)(in_RDI + 8);
    Internal::time(*(Internal **)(in_RDI + 8),in_RSI);
    Internal::start_profiling(pIVar10,(Profile *)(lVar3 + 0x1660),s);
  }
  *(long *)(in_RDI + 0x170) = *(long *)(in_RDI + 0x170) + 1;
  import_clause(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  *(time_t **)(in_RDI + 0x148) = local_10;
  local_28 = find(in_stack_ffffffffffffff00,(uint64_t)in_stack_fffffffffffffef8);
  local_30 = *local_28;
  if (local_30 == (LratCheckerClause *)0x0) {
    fatal_message_start();
    fputs("deleted clause not in proof:\n",_stderr);
    local_b8 = in_RDI + 0xf0;
    local_c0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffed8);
    std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffed8);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffee0,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffed8), bVar4) {
      puVar7 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_c0);
      fprintf(_stderr,"%d ",(ulong)*puVar7);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_c0);
    }
    __b = _stderr;
    fputc(0x30,_stderr);
    fatal_message_end();
  }
  else {
    local_38 = in_RDI + 0xf0;
    local_40._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffed8);
    local_b0._104_8_ = std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffed8);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffee0,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffed8), bVar4) {
      local_b0._96_8_ =
           __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (&local_40);
      pcVar5 = mark(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      *pcVar5 = '\x01';
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_40);
    }
    local_b0._88_8_ = local_30->literals;
    for (local_b0._84_4_ = 0; (uint)local_b0._84_4_ < local_30->size;
        local_b0._84_4_ = local_b0._84_4_ + 1) {
      local_b0._80_4_ = *(int *)(local_b0._88_8_ + (ulong)(uint)local_b0._84_4_ * 4);
      pcVar5 = mark(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      if (*pcVar5 == '\0') {
        fatal_message_start();
        fputs("deleted clause not in proof:\n",_stderr);
        local_b0._72_8_ = in_RDI + 0xf0;
        local_b0._64_8_ = std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffed8);
        local_b0._56_8_ = std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffed8);
        while (bVar4 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffee0,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffed8), bVar4) {
          local_b0._48_8_ =
               __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         (local_b0 + 0x40));
          fprintf(_stderr,"%d ",(ulong)*(uint *)local_b0._48_8_);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     (local_b0 + 0x40));
        }
        fputc(0x30,_stderr);
        fatal_message_end();
      }
    }
    local_b0._40_8_ = in_RDI + 0xf0;
    local_b0._32_8_ = std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffed8);
    local_b0._24_8_ = std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffed8);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffee0,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffed8), bVar4) {
      local_b0._16_8_ =
           __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                      (local_b0 + 0x20));
      pcVar5 = mark(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      *pcVar5 = '\0';
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 (local_b0 + 0x20));
    }
    *(long *)(in_RDI + 0xd0) = *(long *)(in_RDI + 0xd0) + 1;
    *(long *)(in_RDI + 0xc0) = *(long *)(in_RDI + 0xc0) + -1;
    *local_28 = local_30->next;
    local_30->next = *(LratCheckerClause **)(in_RDI + 0xe8);
    *(LratCheckerClause **)(in_RDI + 0xe8) = local_30;
    local_30->garbage = true;
    uVar1 = *(undefined8 *)(in_RDI + 0xd0);
    uVar11 = 0;
    uVar12 = 0;
    auVar8._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar8._0_8_ = uVar1;
    auVar8._12_4_ = 0x45300000;
    dVar13 = 4503599627370496.0;
    dVar14 = 1.9342813113834067e+25;
    local_b0._8_8_ = *(undefined8 *)(in_RDI + 0xd8);
    local_b0._0_8_ = *(undefined8 *)(in_RDI + 0x10);
    __b = (FILE *)local_b0;
    puVar6 = std::max<unsigned_long>((unsigned_long *)(local_b0 + 8),(unsigned_long *)__b);
    uVar2 = *puVar6;
    auVar9._8_4_ = (int)(uVar2 >> 0x20);
    auVar9._0_8_ = uVar2;
    auVar9._12_4_ = 0x45300000;
    if (((auVar9._8_8_ - dVar14) + ((double)CONCAT44(0x43300000,(int)uVar2) - dVar13)) * 0.5 <
        (auVar8._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) {
      collect_garbage_clauses((LratChecker *)CONCAT44(uVar12,uVar11));
    }
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0xdcca46);
  if (*(int *)(*(long *)(in_RDI + 8) + 0x1680) <= *(int *)(*(long *)(in_RDI + 8) + 0xe18)) {
    pIVar10 = *(Internal **)(in_RDI + 8);
    profile = (Profile *)(*(long *)(in_RDI + 8) + 0x1660);
    Internal::time(*(Internal **)(in_RDI + 8),(time_t *)__b);
    Internal::stop_profiling(pIVar10,profile,s_00);
  }
  return;
}

Assistant:

void LratChecker::delete_clause (uint64_t id, bool, const vector<int> &c) {
  START (checking);
  LOG (c, "LRAT CHECKER checking deletion of clause[%" PRIu64 "]", id);
  stats.deleted++;
  import_clause (c);
  last_id = id;
  LratCheckerClause **p = find (id), *d = *p;
  if (d) {
    for (const auto &lit : imported_clause)
      mark (lit) = true;
    const int *dp = d->literals;
    for (unsigned i = 0; i < d->size; i++) {
      int lit = *(dp + i);
      if (!mark (lit)) {        // should never happen since ids
        fatal_message_start (); // are unique.
        fputs ("deleted clause not in proof:\n", stderr);
        for (const auto &lit : imported_clause)
          fprintf (stderr, "%d ", lit);
        fputc ('0', stderr);
        fatal_message_end ();
      }
    }
    for (const auto &lit : imported_clause)
      mark (lit) = false;

    // Remove from hash table, mark as garbage, connect to garbage list.
    num_garbage++;
    assert (num_clauses);
    num_clauses--;
    *p = d->next;
    d->next = garbage;
    garbage = d;
    d->garbage = true;

    // If there are enough garbage clauses collect them.
    // TODO: probably can just delete clause directly without
    // specific garbage collection phase.
    if (num_garbage > 0.5 * max ((size_t) size_clauses, (size_t) size_vars))
      collect_garbage_clauses ();
  } else {
    fatal_message_start ();
    fputs ("deleted clause not in proof:\n", stderr);
    for (const auto &lit : imported_clause)
      fprintf (stderr, "%d ", lit);
    fputc ('0', stderr);
    fatal_message_end ();
  }
  imported_clause.clear ();
  STOP (checking);
}